

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPCDSK.cpp
# Opt level: O1

void __thiscall
Storage::Disk::CPCDSK::set_tracks
          (CPCDSK *this,
          map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
          *tracks)

{
  _Rb_tree_header *p_Var1;
  undefined2 uVar2;
  pointer puVar3;
  pointer pSVar4;
  pointer pSVar5;
  iterator __position;
  __uniq_ptr_impl<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
  _Var6;
  uint8_t *puVar7;
  long lVar8;
  pointer *ppSVar9;
  byte bVar10;
  uint8_t value;
  _Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false> __p_00;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  long lVar13;
  uint uVar14;
  size_t in_RCX;
  Sector *sector;
  long lVar15;
  ulong __n;
  long *plVar16;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  pointer __p;
  _Rb_tree_header *p_Var17;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *sample_2;
  long lVar18;
  Sector *sector_1;
  pointer pSVar19;
  uint8_t *puVar20;
  Sector *sector_2;
  ulong uVar21;
  FileHolder output;
  map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
  sectors;
  undefined1 local_148 [72];
  uint local_100;
  _Bit_pointer local_f8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>,_std::_Select1st<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
  local_60;
  
  p_Var12 = (tracks->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var17 = &(tracks->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var17) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    do {
      track_serialisation((PCMSegment *)local_148,(Track *)p_Var12[1]._M_parent,
                          (Time)0x186a000000001);
      Encodings::MFM::sectors_from_segment
                ((map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
                  *)&local_60,(PCMSegment *)local_148,Double);
      if ((_Bit_type *)local_148._48_8_ != (_Bit_type *)0x0) {
        operator_delete((void *)local_148._48_8_,(long)local_f8 - local_148._48_8_);
        local_148._48_8_ = (_Bit_type *)0x0;
        local_148._56_4_ = 0;
        local_148._64_8_ = (_Bit_type *)0x0;
        local_100 = 0;
        local_f8 = (_Bit_pointer)0x0;
      }
      if ((_Bit_type *)local_148._8_8_ != (_Bit_type *)0x0) {
        operator_delete((void *)local_148._8_8_,local_148._40_8_ - local_148._8_8_);
        local_148._8_8_ = (_Bit_type *)0x0;
        local_148._16_4_ = 0;
        local_148._24_8_ = (_Bit_type *)0x0;
        local_148._32_4_ = 0;
        local_148._40_8_ = (_Bit_pointer)0x0;
      }
      uVar14 = (int)((long)*(undefined8 *)(p_Var12 + 1) >> 0x22) * this->head_count_ +
               (int)*(undefined8 *)(p_Var12 + 1);
      in_RCX = (size_t)uVar14;
      uVar21 = (ulong)(int)uVar14;
      if ((ulong)((long)(this->tracks_).
                        super__Vector_base<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->tracks_).
                        super__Vector_base<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar21) {
        std::
        vector<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
        ::resize(&this->tracks_,uVar21 + 1);
        this->head_position_count_ = *(int *)&p_Var12[1].field_0x4 >> 2;
      }
      puVar3 = (this->tracks_).
               super__Vector_base<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __p_00._M_head_impl =
           *(Track **)
            &puVar3[uVar21]._M_t.
             super___uniq_ptr_impl<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
             ._M_t;
      if ((_Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
           )__p_00._M_head_impl == (Track *)0x0) {
        __p_00._M_head_impl = (Track *)operator_new(0x28);
        *(undefined8 *)
         &((vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
            *)((long)__p_00._M_head_impl + 0x10))->
          super__Vector_base<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
             = 0;
        *(pointer *)
         &((vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
            *)((long)__p_00._M_head_impl + 0x18))->
          super__Vector_base<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
             = (pointer)0x0;
        in_RCX = 0;
        *(pointer *)
         &((vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
            *)((long)__p_00._M_head_impl + 0x20))->
          super__Vector_base<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
             = (pointer)0x0;
        *(uint8_t *)__p_00._M_head_impl = (uint8_t)(*(uint *)&p_Var12[1].field_0x4 >> 2);
        *(char *)((long)__p_00._M_head_impl + 1) = (char)p_Var12[1]._M_color;
        *(undefined8 *)((long)__p_00._M_head_impl + 4) = 0x200000001;
        *(undefined2 *)((long)__p_00._M_head_impl + 0xc) = 0x4e02;
        *(uint8_t *)((long)__p_00._M_head_impl + 0xe) = 0xe5;
        local_148._0_4_ = 0;
        local_148._4_4_ = 0;
        std::
        __uniq_ptr_impl<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
        ::reset((__uniq_ptr_impl<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                 *)(puVar3 + uVar21),__p_00._M_head_impl);
        std::
        unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
        ::~unique_ptr((unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                       *)local_148);
      }
      pSVar4 = *(pointer *)
                &((__p_00._M_head_impl)->sectors).
                 super__Vector_base<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                 ._M_impl;
      pSVar5 = *(pointer *)((long)&(__p_00._M_head_impl)->sectors + 8);
      pSVar19 = pSVar4;
      if (pSVar5 != pSVar4) {
        do {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector(&(pSVar19->super_Sector).samples);
          pSVar19 = pSVar19 + 1;
        } while (pSVar19 != pSVar5);
        *(pointer *)((long)&(__p_00._M_head_impl)->sectors + 8) = pSVar4;
      }
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
        p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          __position._M_current = *(pointer *)((long)&(__p_00._M_head_impl)->sectors + 8);
          if (__position._M_current == *(pointer *)((long)&(__p_00._M_head_impl)->sectors + 0x10)) {
            std::
            vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
            ::_M_realloc_insert<>(&(__p_00._M_head_impl)->sectors,__position);
          }
          else {
            ((__position._M_current)->super_Sector).samples.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((__position._M_current)->super_Sector).samples.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ((__position._M_current)->super_Sector).address.track = '\0';
            ((__position._M_current)->super_Sector).address.side = '\0';
            ((__position._M_current)->super_Sector).address.sector = '\0';
            ((__position._M_current)->super_Sector).size = '\0';
            *(undefined4 *)&((__position._M_current)->super_Sector).field_0x4 = 0;
            ((__position._M_current)->super_Sector).samples.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ((__position._M_current)->super_Sector).has_data_crc_error = false;
            ((__position._M_current)->super_Sector).has_header_crc_error = false;
            ((__position._M_current)->super_Sector).is_deleted = false;
            *(undefined5 *)&((__position._M_current)->super_Sector).field_0x23 = 0;
            ppSVar9 = (pointer *)((long)&(__p_00._M_head_impl)->sectors + 8);
            *ppSVar9 = *ppSVar9 + 1;
          }
          pSVar4 = *(pointer *)((long)&(__p_00._M_head_impl)->sectors + 8);
          pSVar4[-1].super_Sector.address.sector = *(uint8_t *)((long)&p_Var11[1]._M_parent + 2);
          uVar2 = *(undefined2 *)&p_Var11[1]._M_parent;
          pSVar4[-1].super_Sector.address.track = (char)uVar2;
          pSVar4[-1].super_Sector.address.side = (char)((ushort)uVar2 >> 8);
          pSVar4[-1].super_Sector.size = *(uint8_t *)((long)&p_Var11[1]._M_parent + 3);
          pSVar4[-1].super_Sector.has_data_crc_error = *(bool *)&p_Var11[2]._M_parent;
          pSVar4[-1].super_Sector.has_header_crc_error = *(bool *)((long)&p_Var11[2]._M_parent + 1);
          pSVar4[-1].super_Sector.is_deleted = *(bool *)((long)&p_Var11[2]._M_parent + 2);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::_M_move_assign(&pSVar4[-1].super_Sector.samples,&p_Var11[1]._M_left);
          *(undefined2 *)&pSVar4[-1].super_Sector.field_0x23 = 0;
          bVar10 = *(char *)&p_Var11[2]._M_parent << 5;
          pSVar4[-1].super_Sector.field_0x24 = bVar10;
          if (*(char *)((long)&p_Var11[2]._M_parent + 1) != '\0') {
            pSVar4[-1].super_Sector.field_0x23 = 0x20;
          }
          if (*(char *)((long)&p_Var11[2]._M_parent + 2) == '\x01') {
            pSVar4[-1].super_Sector.field_0x24 = bVar10 | 0x40;
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var1);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>,_std::_Select1st<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
      ::~_Rb_tree(&local_60);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var17);
  }
  FileHolder::FileHolder((FileHolder *)local_148,&this->file_name_,Rewrite);
  FileHolder::write((FileHolder *)local_148,0x4e51ac,(void *)0x22,in_RCX);
  FileHolder::write((FileHolder *)local_148,0x4e51cf,(void *)0xe,in_RCX);
  FileHolder::put8((FileHolder *)local_148,(uint8_t)this->head_position_count_);
  FileHolder::put8((FileHolder *)local_148,(uint8_t)this->head_count_);
  FileHolder::putn((FileHolder *)local_148,2,'\0');
  if (this->head_count_ != 0 && this->head_position_count_ != 0) {
    uVar21 = 0;
    do {
      puVar3 = (this->tracks_).
               super__Vector_base<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar21 < (ulong)((long)(this->tracks_).
                                 super__Vector_base<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
        _Var6._M_t.
        super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
        .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>._M_head_impl =
             puVar3[uVar21]._M_t.
             super___uniq_ptr_impl<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
             ._M_t;
        if ((_Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
             )_Var6._M_t.
              super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
              .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>._M_head_impl ==
            (Track *)0x0) {
          FileHolder::put8((FileHolder *)local_148,'\0');
        }
        else {
          lVar13 = 0x100;
          for (lVar15 = *(long *)((long)_Var6._M_t.
                                        super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                        .
                                        super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>
                                        ._M_head_impl + 0x10);
              lVar15 != *(long *)((long)_Var6._M_t.
                                        super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                        .
                                        super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>
                                        ._M_head_impl + 0x18); lVar15 = lVar15 + 0x28) {
            for (plVar16 = *(long **)(lVar15 + 8); plVar16 != *(long **)(lVar15 + 0x10);
                plVar16 = plVar16 + 3) {
              lVar13 = (lVar13 + plVar16[1]) - *plVar16;
            }
          }
          FileHolder::put8((FileHolder *)local_148,
                           (uint8_t)((-(int)lVar13 & 0xffU) + (int)lVar13 >> 8));
        }
      }
      else {
        FileHolder::put8((FileHolder *)local_148,'\0');
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)((long)this->head_count_ * (long)this->head_position_count_));
  }
  lVar15 = FileHolder::tell((FileHolder *)local_148);
  FileHolder::putn((FileHolder *)local_148,0x100 - lVar15,'\0');
  if (this->head_count_ != 0 && this->head_position_count_ != 0) {
    uVar21 = 0;
    do {
      puVar3 = (this->tracks_).
               super__Vector_base<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)(this->tracks_).
                  super__Vector_base<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
      if ((uVar21 < __n) &&
         (_Var6._M_t.
          super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
          .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>._M_head_impl =
               puVar3[uVar21]._M_t.
               super___uniq_ptr_impl<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
               ._M_t,
         (_Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
          )_Var6._M_t.
           super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
           .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>._M_head_impl !=
         (Track *)0x0)) {
        FileHolder::write((FileHolder *)local_148,0x4e51de,(void *)0xd,__n);
        FileHolder::putn((FileHolder *)local_148,3,'\0');
        FileHolder::put8((FileHolder *)local_148,
                         *(uint8_t *)
                          _Var6._M_t.
                          super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                          .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>._M_head_impl
                        );
        FileHolder::put8((FileHolder *)local_148,
                         *(uint8_t *)
                          ((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                 .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>.
                                 _M_head_impl + 1));
        value = (uint8_t)*(uint *)((long)_Var6._M_t.
                                         super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                         .
                                         super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>
                                         ._M_head_impl + 4);
        if (3 < *(uint *)((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>.
                                _M_head_impl + 4)) {
          value = '\0';
        }
        FileHolder::put8((FileHolder *)local_148,value);
        plVar16 = (long *)(ulong)(byte)((*(int *)((long)_Var6._M_t.
                                                                                                                
                                                  super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                                  .
                                                  super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>
                                                  ._M_head_impl + 8) == 2) * '\x02');
        if (*(int *)((long)_Var6._M_t.
                           super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                           .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>.
                           _M_head_impl + 8) == 1) {
          plVar16 = (long *)0x1;
        }
        FileHolder::put8((FileHolder *)local_148,(uint8_t)plVar16);
        FileHolder::put8((FileHolder *)local_148,
                         *(uint8_t *)
                          ((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                 .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>.
                                 _M_head_impl + 0xc));
        FileHolder::put8((FileHolder *)local_148,
                         (char)((uint)(*(int *)((long)_Var6._M_t.
                                                                                                            
                                                  super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                                  .
                                                  super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>
                                                  ._M_head_impl + 0x18) -
                                      *(int *)((long)_Var6._M_t.
                                                                                                          
                                                  super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                                  .
                                                  super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>
                                                  ._M_head_impl + 0x10)) >> 3) * -0x33);
        FileHolder::put8((FileHolder *)local_148,
                         *(uint8_t *)
                          ((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                 .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>.
                                 _M_head_impl + 0xd));
        FileHolder::put8((FileHolder *)local_148,
                         *(uint8_t *)
                          ((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                 .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>.
                                 _M_head_impl + 0xe));
        puVar7 = *(uint8_t **)
                  ((long)_Var6._M_t.
                         super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                         .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>._M_head_impl
                  + 0x18);
        for (puVar20 = *(uint8_t **)
                        ((long)_Var6._M_t.
                               super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                               .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>.
                               _M_head_impl + 0x10); puVar20 != puVar7; puVar20 = puVar20 + 0x28) {
          FileHolder::put8((FileHolder *)local_148,*puVar20);
          FileHolder::put8((FileHolder *)local_148,puVar20[1]);
          FileHolder::put8((FileHolder *)local_148,puVar20[2]);
          FileHolder::put8((FileHolder *)local_148,puVar20[3]);
          FileHolder::put8((FileHolder *)local_148,puVar20[0x23]);
          FileHolder::put8((FileHolder *)local_148,puVar20[0x24]);
          lVar15 = 0;
          for (plVar16 = *(long **)(puVar20 + 8); plVar16 != *(long **)(puVar20 + 0x10);
              plVar16 = plVar16 + 3) {
            lVar15 = (lVar15 + plVar16[1]) - *plVar16;
          }
          FileHolder::put16le((FileHolder *)local_148,(uint16_t)lVar15);
        }
        lVar15 = FileHolder::tell((FileHolder *)local_148);
        FileHolder::putn((FileHolder *)local_148,(ulong)(-(int)lVar15 & 0xff),'\0');
        lVar13 = *(long *)((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                 .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>.
                                 _M_head_impl + 0x18);
        __buf = extraout_RDX;
        for (lVar15 = *(long *)((long)_Var6._M_t.
                                      super__Tuple_impl<0UL,_Storage::Disk::CPCDSK::Track_*,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                                      .super__Head_base<0UL,_Storage::Disk::CPCDSK::Track_*,_false>.
                                      _M_head_impl + 0x10); lVar15 != lVar13; lVar15 = lVar15 + 0x28
            ) {
          lVar8 = *(long *)(lVar15 + 0x10);
          for (lVar18 = *(long *)(lVar15 + 8); lVar18 != lVar8; lVar18 = lVar18 + 0x18) {
            FileHolder::write((FileHolder *)local_148,(int)lVar18,__buf,(size_t)plVar16);
            __buf = extraout_RDX_00;
          }
        }
        lVar15 = FileHolder::tell((FileHolder *)local_148);
        FileHolder::putn((FileHolder *)local_148,(ulong)(-(int)lVar15 & 0xff),'\0');
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)((long)this->head_count_ * (long)this->head_position_count_));
  }
  FileHolder::~FileHolder((FileHolder *)local_148);
  return;
}

Assistant:

void CPCDSK::set_tracks(const std::map<::Storage::Disk::Track::Address, std::shared_ptr<::Storage::Disk::Track>> &tracks) {
	// Patch changed tracks into the disk image.
	for(auto &pair: tracks) {
		// Assume MFM for now; with extensions DSK can contain FM tracks.
		const bool is_double_density = true;
		std::map<std::size_t, Storage::Encodings::MFM::Sector> sectors =
			Storage::Encodings::MFM::sectors_from_segment(
				Storage::Disk::track_serialisation(*pair.second, is_double_density ? Storage::Encodings::MFM::MFMBitLength : Storage::Encodings::MFM::FMBitLength),
				Storage::Encodings::MFM::Density::Double);

		// Find slot for track, making it if neccessary.
		const std::size_t chronological_track = index_for_track(pair.first);
		if(chronological_track >= tracks_.size()) {
			tracks_.resize(chronological_track+1);
			head_position_count_ = pair.first.position.as_int();
		}

		// Get the track, or create it if necessary.
		Track *track = tracks_[chronological_track].get();
		if(!track) {
			track = new Track;
			track->track = uint8_t(pair.first.position.as_int());
			track->side = uint8_t(pair.first.head);
			track->data_rate = Track::DataRate::SingleOrDoubleDensity;
			track->data_encoding = Track::DataEncoding::MFM;
			track->sector_length = 2;
			track->gap3_length = 78;
			track->filler_byte = 0xe5;

			tracks_[chronological_track] = std::unique_ptr<Track>(track);
		}

		// Store sectors.
		track->sectors.clear();
		for(auto &source_sector: sectors) {
			track->sectors.emplace_back();
			Track::Sector &sector = track->sectors.back();

			sector.address = source_sector.second.address;
			sector.size = source_sector.second.size;
			sector.has_data_crc_error = source_sector.second.has_data_crc_error;
			sector.has_header_crc_error = source_sector.second.has_header_crc_error;
			sector.is_deleted = source_sector.second.is_deleted;
			sector.samples = std::move(source_sector.second.samples);

			sector.fdc_status1 = 0;
			sector.fdc_status2 = 0;

			if(source_sector.second.has_data_crc_error)		sector.fdc_status2 |= 0x20;
			if(source_sector.second.has_header_crc_error)	sector.fdc_status1 |= 0x20;
			if(source_sector.second.is_deleted)				sector.fdc_status2 |= 0x40;
		}
	}

	// Rewrite the entire disk image, in extended form.
	Storage::FileHolder output(file_name_, Storage::FileHolder::FileMode::Rewrite);
	output.write(reinterpret_cast<const uint8_t *>("EXTENDED CPC DSK File\r\nDisk-Info\r\n"), 34);
	output.write(reinterpret_cast<const uint8_t *>("Clock Signal  "), 14);
	output.put8(uint8_t(head_position_count_));
	output.put8(uint8_t(head_count_));
	output.putn(2, 0);

	// Output size table.
	for(std::size_t index = 0; index < size_t(head_position_count_ * head_count_); ++index) {
		if(index >= tracks_.size()) {
			output.put8(0);
			continue;
		}
		Track *track = tracks_[index].get();
		if(!track) {
			output.put8(0);
			continue;
		}

		// Calculate size of track.
		std::size_t track_size = 256;
		for(auto &sector: track->sectors) {
			for(auto &sample: sector.samples) {
				track_size += sample.size();
			}
		}

		// Round upward and output.
		track_size += (256 - (track_size & 255)) & 255;
		output.put8(uint8_t(track_size >> 8));
	}

	// Advance to offset 256.
	output.putn(size_t(256 - output.tell()), 0);

	// Output each track.
	for(std::size_t index = 0; index < size_t(head_position_count_ * head_count_); ++index) {
		if(index >= tracks_.size()) continue;
		Track *const track = tracks_[index].get();
		if(!track) continue;

		// Output track header.
		output.write(reinterpret_cast<const uint8_t *>("Track-Info\r\n"), 13);
		output.putn(3, 0);
		output.put8(track->track);
		output.put8(track->side);
		switch (track->data_rate) {
			default:
				output.put8(0);
			break;
			case Track::DataRate::SingleOrDoubleDensity:
				output.put8(1);
			break;
			case Track::DataRate::HighDensity:
				output.put8(2);
			break;
			case Track::DataRate::ExtendedDensity:
				output.put8(3);
			break;
		}
		switch (track->data_encoding) {
			default:
				output.put8(0);
			break;
			case Track::DataEncoding::FM:
				output.put8(1);
			break;
			case Track::DataEncoding::MFM:
				output.put8(2);
			break;
		}
		output.put8(track->sector_length);
		output.put8(uint8_t(track->sectors.size()));
		output.put8(track->gap3_length);
		output.put8(track->filler_byte);

		// Output sector information list.
		for(auto &sector: track->sectors) {
			output.put8(sector.address.track);
			output.put8(sector.address.side);
			output.put8(sector.address.sector);
			output.put8(sector.size);
			output.put8(sector.fdc_status1);
			output.put8(sector.fdc_status2);

			std::size_t data_size = 0;
			for(auto &sample: sector.samples) {
				data_size += sample.size();
			}
			output.put16le(uint16_t(data_size));
		}

		// Move to next 256-byte boundary.
		long distance = (256 - (output.tell()&255))&255;
		output.putn(size_t(distance), 0);

		// Output sector contents.
		for(auto &sector: track->sectors) {
			for(auto &sample: sector.samples) {
				output.write(sample);
			}
		}

		// Move to next 256-byte boundary.
		distance = (256 - (output.tell()&255))&255;
		output.putn(size_t(distance), 0);
	}
}